

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void ssh2_bpp_queue_disconnect(BinaryPacketProtocol *bpp,char *msg,int category)

{
  PktOut *pPVar1;
  PktOut *pkt;
  int category_local;
  char *msg_local;
  BinaryPacketProtocol *bpp_local;
  
  pPVar1 = ssh_bpp_new_pktout(bpp,1);
  BinarySink_put_uint32(pPVar1->binarysink_,(long)category);
  BinarySink_put_stringz(pPVar1->binarysink_,msg);
  BinarySink_put_stringz(pPVar1->binarysink_,"en");
  pq_base_push(&(bpp->out_pq).pqb,&pPVar1->qnode);
  return;
}

Assistant:

void ssh2_bpp_queue_disconnect(BinaryPacketProtocol *bpp,
                               const char *msg, int category)
{
    PktOut *pkt = ssh_bpp_new_pktout(bpp, SSH2_MSG_DISCONNECT);
    put_uint32(pkt, category);
    put_stringz(pkt, msg);
    put_stringz(pkt, "en");            /* language tag */
    pq_push(&bpp->out_pq, pkt);
}